

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O2

DynamicObject * __thiscall
JsrtDebugManager::SetBreakPoint
          (JsrtDebugManager *this,ScriptContext *scriptContext,Utf8SourceInfo *utf8SourceInfo,
          UINT lineNumber,UINT columnNumber)

{
  ScriptContext *scriptContext_00;
  StatementLocation statement_00;
  StatementLocation statement_01;
  HRESULT HVar1;
  charcount_t cVar2;
  BOOL BVar3;
  DebugDocument *this_00;
  size_t sVar4;
  BreakpointProbe *this_01;
  JsrtDebugDocumentManager *this_02;
  DynamicObject *pDVar5;
  charcount_t local_5c;
  undefined1 auStack_58 [4];
  charcount_t byteOffset;
  StatementLocation statement;
  
  statement.bytecodeSpan = (Interval)this;
  this_00 = Js::Utf8SourceInfo::GetDebugDocument(utf8SourceInfo);
  if (((this_00 != (DebugDocument *)0x0) &&
      (HVar1 = Js::Utf8SourceInfo::EnsureLineOffsetCacheNoThrow(utf8SourceInfo), -1 < HVar1)) &&
     (sVar4 = Js::Utf8SourceInfo::GetLineCount(utf8SourceInfo), lineNumber < sVar4)) {
    local_5c = 0;
    cVar2 = Js::LineOffsetCache::GetCharacterOffsetForLine
                      ((utf8SourceInfo->m_lineOffsetCache).ptr,lineNumber,&local_5c);
    statement.function = (FunctionBody *)0x0;
    statement.statement.begin = 0;
    statement.statement.end = 0;
    BVar3 = Js::DebugDocument::GetStatementLocation
                      (this_00,cVar2 + columnNumber + 1,(StatementLocation *)auStack_58);
    if (BVar3 != 0) {
      statement_00.statement = (Interval)statement.function;
      statement_00.function = _auStack_58;
      statement_00.bytecodeSpan = statement.statement;
      this_01 = Js::DebugDocument::FindBreakpoint(this_00,statement_00);
      if (this_01 == (BreakpointProbe *)0x0) {
        statement_01.statement = (Interval)statement.function;
        statement_01.function = _auStack_58;
        statement_01.bytecodeSpan = statement.statement;
        this_01 = Js::DebugDocument::SetBreakPoint(this_00,statement_01,BREAKPOINT_ENABLED);
        if (this_01 == (BreakpointProbe *)0x0) {
          return (DynamicObject *)0x0;
        }
        this_02 = GetDebugDocumentManager((JsrtDebugManager *)statement.bytecodeSpan);
        JsrtDebugDocumentManager::AddDocument(this_02,this_01->breakpointId,this_00);
      }
      Js::BreakpointProbe::GetStatementLocation(this_01,(StatementLocation *)auStack_58);
      scriptContext_00 = (this_00->utf8SourceInfo->m_scriptContext).ptr;
      pDVar5 = Js::JavascriptLibrary::CreateObject
                         ((scriptContext->super_ScriptContextBase).javascriptLibrary,false,0);
      pDVar5 = (DynamicObject *)Js::CrossSite::MarshalVar(scriptContext_00,pDVar5,false);
      JsrtDebugUtils::AddPropertyToObject
                (pDVar5,(JsrtDebugPropertyId)0x1,this_01->breakpointId,scriptContext);
      JsrtDebugUtils::AddLineColumnToObject(pDVar5,_auStack_58,statement.statement.begin);
      JsrtDebugUtils::AddScriptIdToObject(pDVar5,utf8SourceInfo);
      return pDVar5;
    }
  }
  return (DynamicObject *)0x0;
}

Assistant:

Js::DynamicObject* JsrtDebugManager::SetBreakPoint(Js::ScriptContext* scriptContext, Js::Utf8SourceInfo* utf8SourceInfo, UINT lineNumber, UINT columnNumber)
{
    Js::DebugDocument* debugDocument = utf8SourceInfo->GetDebugDocument();
    if (debugDocument != nullptr && SUCCEEDED(utf8SourceInfo->EnsureLineOffsetCacheNoThrow()) && lineNumber < utf8SourceInfo->GetLineCount())
    {
        charcount_t charPosition = 0;
        charcount_t byteOffset = 0;
        utf8SourceInfo->GetCharPositionForLineInfo((charcount_t)lineNumber, &charPosition, &byteOffset);
        long ibos = charPosition + columnNumber + 1;

        Js::StatementLocation statement;
        if (!debugDocument->GetStatementLocation(ibos, &statement))
        {
            return nullptr;
        }

        // Don't see a use case for supporting multiple breakpoints at same location.
        // If a breakpoint already exists, just return that
        Js::BreakpointProbe* probe = debugDocument->FindBreakpoint(statement);
        if (probe == nullptr)
        {
            probe = debugDocument->SetBreakPoint(statement, BREAKPOINT_ENABLED);

            if(probe == nullptr)
            {
                return nullptr;
            }

            this->GetDebugDocumentManager()->AddDocument(probe->GetId(), debugDocument);
        }

        probe->GetStatementLocation(&statement);

        Js::DynamicObject* bpObject = (Js::DynamicObject*)Js::CrossSite::MarshalVar(debugDocument->GetUtf8SourceInfo()->GetScriptContext(), scriptContext->GetLibrary()->CreateObject());

        JsrtDebugUtils::AddPropertyToObject(bpObject, JsrtDebugPropertyId::breakpointId, probe->GetId(), scriptContext);
        JsrtDebugUtils::AddLineColumnToObject(bpObject, statement.function, statement.bytecodeSpan.begin);
        JsrtDebugUtils::AddScriptIdToObject(bpObject, utf8SourceInfo);

        return bpObject;
    }

    return nullptr;
}